

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_function_constructor(JSContext *ctx,JSValue new_target,int argc,JSValue *argv,int magic)

{
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  JSValue v_03;
  JSValue func_obj;
  JSValue val;
  JSValue this_obj;
  JSValue v_04;
  JSValue proto_val;
  JSValue v_05;
  JSValue obj_00;
  JSValue v_06;
  JSValue JVar1;
  int iVar2;
  int in_ECX;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSContext *in_RDI;
  uint in_R9D;
  JSValue JVar3;
  JSContext *realm;
  JSAtom in_stack_0000002c;
  JSContext *in_stack_00000030;
  undefined1 in_stack_00000038 [16];
  JSValue in_stack_00000048;
  StringBuffer *b;
  StringBuffer b_s;
  JSValue obj;
  JSValue proto;
  JSValue s;
  int ret;
  int n;
  int i;
  JSFunctionKindEnum func_kind;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  JSValueUnion in_stack_fffffffffffffee0;
  JSValueUnion in_stack_fffffffffffffee8;
  JSContext *in_stack_fffffffffffffef0;
  StringBuffer *in_stack_ffffffffffffff08;
  JSValueUnion JVar4;
  undefined8 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffff1c;
  int flags;
  JSValueUnion ctx_00;
  JSValueUnion JVar6;
  int64_t in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff38 [12];
  BOOL in_stack_ffffffffffffff44;
  JSContext *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff60;
  undefined4 uVar7;
  undefined4 uVar8;
  int local_74;
  int32_t local_40;
  undefined4 uStack_3c;
  int64_t local_38;
  JSValueUnion local_8;
  
  JVar6.ptr = &stack0xffffffffffffff30;
  string_buffer_init((JSContext *)in_stack_fffffffffffffee0.ptr,
                     (StringBuffer *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),0
                    );
  string_buffer_putc8((StringBuffer *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                      0);
  if ((in_R9D == 2) || (in_R9D == 3)) {
    string_buffer_puts8((StringBuffer *)in_stack_fffffffffffffef0,
                        (char *)in_stack_fffffffffffffee8.ptr);
  }
  string_buffer_puts8((StringBuffer *)in_stack_fffffffffffffef0,
                      (char *)in_stack_fffffffffffffee8.ptr);
  if ((in_R9D == 1) || (in_R9D == 3)) {
    string_buffer_putc8((StringBuffer *)
                        CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),0);
  }
  string_buffer_puts8((StringBuffer *)in_stack_fffffffffffffef0,
                      (char *)in_stack_fffffffffffffee8.ptr);
  for (local_74 = 0; local_74 < in_ECX + -1; local_74 = local_74 + 1) {
    if (local_74 != 0) {
      string_buffer_putc8((StringBuffer *)
                          CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),0);
    }
    JVar3.tag._0_4_ = in_stack_ffffffffffffff18;
    JVar3.u.ptr = (void *)in_stack_ffffffffffffff10;
    JVar3.tag._4_4_ = in_stack_ffffffffffffff1c;
    iVar2 = string_buffer_concat_value(in_stack_ffffffffffffff08,JVar3);
    if (iVar2 != 0) goto LAB_0014d53f;
  }
  string_buffer_puts8((StringBuffer *)in_stack_fffffffffffffef0,
                      (char *)in_stack_fffffffffffffee8.ptr);
  if ((in_ECX + -1 < 0) ||
     (v_03.tag._0_4_ = in_stack_ffffffffffffff18, v_03.u.ptr = (void *)in_stack_ffffffffffffff10,
     v_03.tag._4_4_ = in_stack_ffffffffffffff1c,
     iVar2 = string_buffer_concat_value(in_stack_ffffffffffffff08,v_03), iVar2 == 0)) {
    string_buffer_puts8((StringBuffer *)in_stack_fffffffffffffef0,
                        (char *)in_stack_fffffffffffffee8.ptr);
    JVar3 = string_buffer_end((StringBuffer *)in_stack_fffffffffffffee0.ptr);
    uVar5 = JVar3.u._0_4_;
    flags = JVar3.u._4_4_;
    ctx_00 = (JSValueUnion)JVar3.tag;
    iVar2 = JS_IsException(JVar3);
    if (iVar2 == 0) {
      this_obj.tag._4_4_ = in_stack_ffffffffffffff44;
      this_obj._0_12_ = in_stack_ffffffffffffff38;
      val.tag = in_stack_ffffffffffffff30;
      val.u.float64 = JVar6.float64;
      JVar3 = JS_EvalObject((JSContext *)ctx_00.ptr,this_obj,val,flags,in_stack_ffffffffffffff60);
      JVar4 = JVar3.u;
      local_38 = JVar3.tag;
      v.tag = (int64_t)in_stack_fffffffffffffef0;
      v.u.ptr = in_stack_fffffffffffffee8.ptr;
      JS_FreeValue((JSContext *)in_stack_fffffffffffffee0.ptr,v);
      v_04.tag = local_38;
      v_04.u.float64 = JVar4.float64;
      iVar2 = JS_IsException(v_04);
      if (iVar2 == 0) {
        v_06.tag = in_RDX;
        v_06.u.float64 = in_RSI.float64;
        iVar2 = JS_IsUndefined(v_06);
        if (iVar2 != 0) {
LAB_0014d520:
          local_40 = JVar4.int32;
          uStack_3c = JVar4._4_4_;
          goto LAB_0014d57a;
        }
        JVar3 = JS_GetPropertyInternal
                          (in_stack_00000030,in_stack_00000048,in_stack_0000002c,
                           (JSValue)in_stack_00000038,(BOOL)ctx);
        local_8 = (JSValueUnion)JVar3.tag;
        uVar7 = JVar3.u._0_4_;
        uVar8 = JVar3.u._4_4_;
        iVar2 = JS_IsException(JVar3);
        if (iVar2 == 0) {
          v_05.u._4_4_ = uVar8;
          v_05.u.int32 = uVar7;
          v_05.tag = (int64_t)local_8.ptr;
          iVar2 = JS_IsObject(v_05);
          if (iVar2 == 0) {
            v_00.tag = (int64_t)in_stack_fffffffffffffef0;
            v_00.u.ptr = in_stack_fffffffffffffee8.ptr;
            JS_FreeValue((JSContext *)in_stack_fffffffffffffee0.ptr,v_00);
            func_obj.tag = (int64_t)JVar6.ptr;
            func_obj.u.float64 = ctx_00.float64;
            in_stack_fffffffffffffef0 =
                 JS_GetFunctionRealm((JSContext *)CONCAT44(flags,uVar5),func_obj);
            if (in_stack_fffffffffffffef0 == (JSContext *)0x0) goto LAB_0014d549;
            JVar3 = JS_DupValue(in_RDI,in_stack_fffffffffffffef0->class_proto
                                       [func_kind_to_class_id[in_R9D]]);
            in_stack_fffffffffffffee0 = JVar3.u;
            in_stack_fffffffffffffee8 = (JSValueUnion)JVar3.tag;
            uVar7 = JVar3.u._0_4_;
            uVar8 = JVar3.u._4_4_;
            local_8 = in_stack_fffffffffffffee8;
          }
          obj_00.u._4_4_ = uVar8;
          obj_00.u.int32 = uVar7;
          obj_00.tag = (int64_t)local_8.ptr;
          proto_val.tag = local_38;
          proto_val.u.float64 = JVar4.float64;
          iVar2 = JS_SetPrototypeInternal
                            (in_stack_ffffffffffffff48,obj_00,proto_val,in_stack_ffffffffffffff44);
          v_01.tag = (int64_t)in_stack_fffffffffffffef0;
          v_01.u.ptr = in_stack_fffffffffffffee8.ptr;
          JS_FreeValue((JSContext *)in_stack_fffffffffffffee0.ptr,v_01);
          if (-1 < iVar2) goto LAB_0014d520;
        }
      }
    }
  }
  else {
LAB_0014d53f:
    string_buffer_free((StringBuffer *)0x14d549);
  }
LAB_0014d549:
  v_02.tag = (int64_t)in_stack_fffffffffffffef0;
  v_02.u.ptr = in_stack_fffffffffffffee8.ptr;
  JS_FreeValue((JSContext *)in_stack_fffffffffffffee0.ptr,v_02);
  local_40 = 0;
  local_38 = 6;
LAB_0014d57a:
  JVar1.u._4_4_ = uStack_3c;
  JVar1.u.int32 = local_40;
  JVar1.tag = local_38;
  return JVar1;
}

Assistant:

static JSValue js_function_constructor(JSContext *ctx, JSValueConst new_target,
                                       int argc, JSValueConst *argv, int magic)
{
    JSFunctionKindEnum func_kind = magic;
    int i, n, ret;
    JSValue s, proto, obj = JS_UNDEFINED;
    StringBuffer b_s, *b = &b_s;

    string_buffer_init(ctx, b, 0);
    string_buffer_putc8(b, '(');
    
    if (func_kind == JS_FUNC_ASYNC || func_kind == JS_FUNC_ASYNC_GENERATOR) {
        string_buffer_puts8(b, "async ");
    }
    string_buffer_puts8(b, "function");

    if (func_kind == JS_FUNC_GENERATOR || func_kind == JS_FUNC_ASYNC_GENERATOR) {
        string_buffer_putc8(b, '*');
    }
    string_buffer_puts8(b, " anonymous(");

    n = argc - 1;
    for(i = 0; i < n; i++) {
        if (i != 0) {
            string_buffer_putc8(b, ',');
        }
        if (string_buffer_concat_value(b, argv[i]))
            goto fail;
    }
    string_buffer_puts8(b, "\n) {\n");
    if (n >= 0) {
        if (string_buffer_concat_value(b, argv[n]))
            goto fail;
    }
    string_buffer_puts8(b, "\n})");
    s = string_buffer_end(b);
    if (JS_IsException(s))
        goto fail1;

    obj = JS_EvalObject(ctx, ctx->global_obj, s, JS_EVAL_TYPE_INDIRECT, -1);
    JS_FreeValue(ctx, s);
    if (JS_IsException(obj))
        goto fail1;
    if (!JS_IsUndefined(new_target)) {
        /* set the prototype */
        proto = JS_GetProperty(ctx, new_target, JS_ATOM_prototype);
        if (JS_IsException(proto))
            goto fail1;
        if (!JS_IsObject(proto)) {
            JSContext *realm;
            JS_FreeValue(ctx, proto);
            realm = JS_GetFunctionRealm(ctx, new_target);
            if (!realm)
                goto fail1;
            proto = JS_DupValue(ctx, realm->class_proto[func_kind_to_class_id[func_kind]]);
        }
        ret = JS_SetPrototypeInternal(ctx, obj, proto, TRUE);
        JS_FreeValue(ctx, proto);
        if (ret < 0)
            goto fail1;
    }
    return obj;

 fail:
    string_buffer_free(b);
 fail1:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}